

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping.c
# Opt level: O0

int mpt_mapping_del(mpt_array *arr,mpt_valsrc *src,mpt_laydest *dst,int cli)

{
  char *pcVar1;
  mpt_buffer *pmVar2;
  ulong uVar3;
  _mpt_vptr_buffer **pp_Var4;
  long local_68;
  size_t used;
  mpt_mapping *empty;
  size_t del;
  size_t len;
  size_t i;
  mpt_mapping *map;
  mpt_buffer *buf;
  int cli_local;
  mpt_laydest *dst_local;
  mpt_valsrc *src_local;
  mpt_array *arr_local;
  
  empty = (mpt_mapping *)0x0;
  pmVar2 = arr->_buf;
  if (pmVar2 == (mpt_buffer *)0x0) {
    arr_local._4_4_ = 0;
  }
  else {
    uVar3 = pmVar2->_used >> 3;
    for (len = 0; len < uVar3; len = len + 1) {
      if (((uint)*(ushort *)((long)&pmVar2[1]._vptr + len * 8 + 2) == cli) &&
         ((dst == (mpt_laydest *)0x0 ||
          ((((*(uint8_t *)((long)&pmVar2[1]._vptr + len * 8 + 4) == dst->lay &&
             (*(uint8_t *)((long)&pmVar2[1]._vptr + len * 8 + 5) == dst->grf)) &&
            (*(uint8_t *)((long)&pmVar2[1]._vptr + len * 8 + 6) == dst->wld)) &&
           (*(uint8_t *)((long)&pmVar2[1]._vptr + len * 8 + 7) == dst->dim)))))) {
        if (src == (mpt_valsrc *)0x0) {
          *(undefined1 *)((long)&pmVar2[1]._vptr + len * 8 + 1) = 0;
        }
        else {
          if (*(uint8_t *)(&pmVar2[1]._vptr + len) != src->dim) goto LAB_00104b10;
          *(byte *)((long)&pmVar2[1]._vptr + len * 8 + 1) =
               *(byte *)((long)&pmVar2[1]._vptr + len * 8 + 1) & (src->state ^ 0xff);
        }
        empty = (mpt_mapping *)&(empty->src).state;
      }
LAB_00104b10:
    }
    if (empty != (mpt_mapping *)0x0) {
      local_68 = 0;
      used = 0;
      for (len = 0; len < uVar3; len = len + 1) {
        pp_Var4 = (_mpt_vptr_buffer **)used;
        if (*(char *)((long)&pmVar2[1]._vptr + len * 8 + 1) == '\0') {
          if (used == 0) {
            pp_Var4 = &pmVar2[1]._vptr + len;
          }
        }
        else {
          local_68 = local_68 + 1;
          if (used != 0) {
            *(_mpt_vptr_buffer **)used = (&pmVar2[1]._vptr)[len];
            *(undefined1 *)((long)&pmVar2[1]._vptr + len * 8 + 1) = 0;
            do {
              pp_Var4 = (_mpt_vptr_buffer **)(used + 8);
              if (&pmVar2[1]._vptr + len <= pp_Var4) break;
              pcVar1 = (char *)(used + 9);
              used = (size_t)pp_Var4;
            } while (*pcVar1 != '\0');
          }
        }
        used = (size_t)pp_Var4;
      }
      pmVar2->_used = local_68 << 3;
    }
    arr_local._4_4_ = (int)empty;
  }
  return arr_local._4_4_;
}

Assistant:

extern int mpt_mapping_del(const MPT_STRUCT(array) *arr, const MPT_STRUCT(valsrc) *src, const MPT_STRUCT(laydest) *dst, int cli)
{
	MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(mapping) *map;
	size_t i, len = 0, del = 0;
	
	if (!(buf = arr->_buf)) {
		return 0;
	}
	len = buf->_used / sizeof(*map);
	map = (void *) (buf + 1);
	
	/* binding matches existing */
	for (i = 0; i < len; ++i) {
		/* binding not mergeable */
		if (map[i].client != cli) {
			continue;
		}
		if (dst
		    && (map[i].dest.lay != dst->lay || map[i].dest.grf != dst->grf
		     || map[i].dest.wld != dst->wld || map[i].dest.dim != dst->dim)) {
			continue;
		}
		if (!src) {
			map[i].src.state = 0;
		}
		else if (map[i].src.dim != src->dim) {
			continue;
		}
		else {
			map[i].src.state &= ~src->state;
		}
		++del;
	}
	if (del) {
		MPT_STRUCT(mapping) *empty;
		size_t used;
		
		for (i = 0, used = 0, empty = 0; i < len; ++i) {
			if (!map[i].src.state) {
				if (!empty) {
					empty = map+i;
				}
				continue;
			}
			/* track number of active mappings */
			++used;
			
			/* no smaller position available */
			if (!empty) continue;
			
			/* move command entry */
			*empty = map[i];
			map[i].src.state = 0;
			
			/* find smallest free position */
			while (++empty < (map+i)) {
				if (!empty->src.state) {
					break;
				}
			}
		}
		buf->_used = used * sizeof(*map);
	}
	return del;
}